

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_tracing.cpp
# Opt level: O1

ze_result_t zelLoaderGetVersion(zel_component_version_t *version)

{
  if (version != (zel_component_version_t *)0x0) {
    version->component_name[0x30] = '\0';
    version->component_name[0x31] = '\0';
    version->component_name[0x32] = '\0';
    version->component_name[0x33] = '\0';
    version->component_name[0x34] = '\0';
    version->component_name[0x35] = '\0';
    version->component_name[0x36] = '\0';
    version->component_name[0x37] = '\0';
    version->component_name[0x38] = '\0';
    version->component_name[0x39] = '\0';
    version->component_name[0x3a] = '\0';
    version->component_name[0x3b] = '\0';
    version->component_name[0x3c] = '\0';
    version->component_name[0x3d] = '\0';
    version->component_name[0x3e] = '\0';
    version->component_name[0x3f] = '\0';
    version->component_name[0x20] = '\0';
    version->component_name[0x21] = '\0';
    version->component_name[0x22] = '\0';
    version->component_name[0x23] = '\0';
    version->component_name[0x24] = '\0';
    version->component_name[0x25] = '\0';
    version->component_name[0x26] = '\0';
    version->component_name[0x27] = '\0';
    version->component_name[0x28] = '\0';
    version->component_name[0x29] = '\0';
    version->component_name[0x2a] = '\0';
    version->component_name[0x2b] = '\0';
    version->component_name[0x2c] = '\0';
    version->component_name[0x2d] = '\0';
    version->component_name[0x2e] = '\0';
    version->component_name[0x2f] = '\0';
    version->component_name[0x10] = '\0';
    version->component_name[0x11] = '\0';
    version->component_name[0x12] = '\0';
    version->component_name[0x13] = '\0';
    version->component_name[0x14] = '\0';
    version->component_name[0x15] = '\0';
    version->component_name[0x16] = '\0';
    version->component_name[0x17] = '\0';
    version->component_name[0x18] = '\0';
    version->component_name[0x19] = '\0';
    version->component_name[0x1a] = '\0';
    version->component_name[0x1b] = '\0';
    version->component_name[0x1c] = '\0';
    version->component_name[0x1d] = '\0';
    version->component_name[0x1e] = '\0';
    version->component_name[0x1f] = '\0';
    builtin_strncpy(version->component_name,"tracing layer",0xe);
    version->component_name[0xe] = '\0';
    version->component_name[0xf] = '\0';
    version->spec_version = ZE_API_VERSION_1_13;
    (version->component_lib_version).major = 1;
    (version->component_lib_version).minor = 0x16;
    (version->component_lib_version).patch = 0;
    return ZE_RESULT_SUCCESS;
  }
  return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zelLoaderGetVersion(zel_component_version_t *version)    
{
    if(version == nullptr)
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    string_copy_s(version->component_name, TRACING_COMP_NAME, ZEL_COMPONENT_STRING_SIZE);
    version->spec_version = ZE_API_VERSION_CURRENT;
    version->component_lib_version.major = LOADER_VERSION_MAJOR;
    version->component_lib_version.minor = LOADER_VERSION_MINOR;
    version->component_lib_version.patch = LOADER_VERSION_PATCH;

    return ZE_RESULT_SUCCESS;
}